

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

bool __thiscall bssl::SSL_apply_handoff(bssl *this,SSL *ssl,Span<const_unsigned_char> handoff)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  BUF_MEM *__p;
  pointer buf;
  uint8_t *in;
  size_t sVar4;
  pointer pSVar5;
  Span<const_unsigned_char> SVar6;
  SSL3_STATE *s3;
  CBS hs_buf;
  CBS transcript;
  uint64_t handoff_version;
  undefined1 local_48 [8];
  CBS handoff_cbs;
  CBS seq;
  SSL *ssl_local;
  Span<const_unsigned_char> handoff_local;
  
  bVar2 = uses_disallowed_feature((SSL *)this);
  if (!bVar2) {
    SVar6.size_ = (size_t)handoff.data_;
    SVar6.data_ = (uchar *)ssl;
    cbs_st::cbs_st((cbs_st *)local_48,SVar6);
    iVar3 = CBS_get_asn1((CBS *)local_48,(CBS *)&handoff_cbs.len,0x20000010);
    if ((((iVar3 != 0) &&
         (iVar3 = CBS_get_asn1_uint64((CBS *)&handoff_cbs.len,&transcript.len), iVar3 != 0)) &&
        (transcript.len == 0)) &&
       (((iVar3 = CBS_get_asn1((CBS *)&handoff_cbs.len,(CBS *)&hs_buf.len,4), iVar3 != 0 &&
         (iVar3 = CBS_get_asn1((CBS *)&handoff_cbs.len,(CBS *)&s3,4), iVar3 != 0)) &&
        (bVar2 = apply_remote_features((SSL *)this,(CBS *)&handoff_cbs.len), bVar2)))) {
      SSL_set_accept_state((SSL *)this);
      lVar1 = *(long *)(this + 0x30);
      *(ushort *)(lVar1 + 0xdc) = *(ushort *)(lVar1 + 0xdc) & 0xfffd | 2;
      *(ushort *)(lVar1 + 0xdc) = *(ushort *)(lVar1 + 0xdc) & 0xfff7 | 8;
      __p = BUF_MEM_new();
      std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::reset
                ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)(lVar1 + 0xe0),(pointer)__p);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(lVar1 + 0xe0));
      if (bVar2) {
        buf = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)(lVar1 + 0xe0));
        in = CBS_data((CBS *)&s3);
        sVar4 = CBS_len((CBS *)&s3);
        iVar3 = BUF_MEM_append(buf,in,sVar4);
        if (iVar3 != 0) {
          sVar4 = CBS_len((CBS *)&hs_buf.len);
          if (sVar4 != 0) {
            pSVar5 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                               ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                                (lVar1 + 0x118));
            SVar6 = cbs_st::operator_cast_to_Span((cbs_st *)&hs_buf.len);
            SSLTranscript::Update(&pSVar5->transcript,SVar6);
            *(ushort *)(lVar1 + 0xdc) = *(ushort *)(lVar1 + 0xdc) & 0xfffb | 4;
          }
          pSVar5 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                              (lVar1 + 0x118));
          *(uint *)&pSVar5->field_0x6c8 = *(uint *)&pSVar5->field_0x6c8 & 0xfff7ffff | 0x80000;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool SSL_apply_handoff(SSL *ssl, Span<const uint8_t> handoff) {
  if (uses_disallowed_feature(ssl)) {
    return false;
  }

  CBS seq, handoff_cbs(handoff);
  uint64_t handoff_version;
  if (!CBS_get_asn1(&handoff_cbs, &seq, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&seq, &handoff_version) ||
      handoff_version != kHandoffVersion) {
    return false;
  }

  CBS transcript, hs_buf;
  if (!CBS_get_asn1(&seq, &transcript, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1(&seq, &hs_buf, CBS_ASN1_OCTETSTRING) ||
      !apply_remote_features(ssl, &seq)) {
    return false;
  }

  SSL_set_accept_state(ssl);

  SSL3_STATE *const s3 = ssl->s3;
  s3->v2_hello_done = true;
  s3->has_message = true;

  s3->hs_buf.reset(BUF_MEM_new());
  if (!s3->hs_buf ||
      !BUF_MEM_append(s3->hs_buf.get(), CBS_data(&hs_buf), CBS_len(&hs_buf))) {
    return false;
  }

  if (CBS_len(&transcript) != 0) {
    s3->hs->transcript.Update(transcript);
    s3->is_v2_hello = true;
  }
  s3->hs->handback = true;

  return true;
}